

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
immutable::vector_iterator<int,_false,_6>::vector_iterator
          (vector_iterator<int,_false,_6> *this,ref<immutable::rrb<int,_false,_6>_> *impl)

{
  rrb<int,_false,_6> *prVar1;
  
  prVar1 = impl->ptr;
  (this->_impl).ptr = prVar1;
  if (prVar1 != (rrb<int,_false,_6> *)0x0) {
    prVar1->_ref_count = prVar1->_ref_count + 1;
  }
  prVar1 = ref<immutable::rrb<int,_false,_6>_>::operator->(impl);
  this->_index = prVar1->cnt;
  (this->_cursor).super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
  super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int> =
       (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
  (this->_cursor).super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
  super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false> =
       0xffffffff;
  (this->_cursor).super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
  super__Head_base<0UL,_const_int_*,_false>._M_head_impl = (int *)0x0;
  return;
}

Assistant:

vector_iterator(const ref<rrb<T, atomic_ref_counting, N>>& impl, end_type) : _impl(impl), _index(impl->cnt), _cursor{ nullptr, (size_type)-1, (size_type)-1 } {}